

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O3

void __thiscall FRandom::GenRandAll(FRandom *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  QWORD QVar5;
  QWORD QVar6;
  QWORD QVar7;
  anon_union_80_3_cd421760_for_sfmt *paVar8;
  anon_union_80_3_cd421760_for_sfmt *paVar9;
  long lVar10;
  anon_union_80_3_cd421760_for_sfmt *paVar11;
  anon_union_80_3_cd421760_for_sfmt *paVar12;
  
  lVar10 = -8;
  paVar8 = (anon_union_80_3_cd421760_for_sfmt *)((this->sfmt).u64 + 6);
  paVar11 = (anon_union_80_3_cd421760_for_sfmt *)((this->sfmt).u + 0x10);
  paVar12 = &this->sfmt;
  do {
    paVar9 = paVar11;
    uVar1 = paVar8->u[3];
    QVar7 = paVar8->u64[1];
    QVar6 = paVar8->u64[1];
    QVar5 = paVar8->u64[0];
    uVar2 = paVar12->u[2];
    uVar3 = paVar12->u[0];
    uVar4 = paVar12->u[1];
    paVar12->u[0] =
         paVar9->u[0] << 0xf ^ (uint)(QVar5 >> 0x18) ^
         (paVar12->u[8] >> 0xd & 0x737ff | uVar3 << 0x18) ^ uVar3;
    paVar12->u[1] =
         paVar9->u[1] << 0xf ^ paVar12->u[9] >> 0xd & 0x73f7d ^ uVar4 ^
         ((uint)(byte)(QVar5 >> 0x38) | (uint)(((ulong)(uint)QVar7 << 0x28) >> 0x20)) ^
         ((uint)(((ulong)uVar4 << 0x38) >> 0x20) | uVar3 >> 8);
    paVar12->u[2] =
         paVar9->u[2] << 0xf ^ uVar2 ^
         (uint)(QVar6 >> 0x18) ^ paVar12->u[10] >> 0xd & 0x77b7d ^ (uVar2 << 0x18 | uVar4 >> 8);
    paVar12->u[3] =
         paVar9->u[3] << 0xf ^ paVar12->u[3] ^
         paVar12->u[0xb] >> 0xd & 0x7fb2f ^ uVar1 >> 0x18 ^
         ((uint)(((ulong)paVar12->u[3] << 0x38) >> 0x20) | uVar2 >> 8);
    lVar10 = lVar10 + -0x10;
    paVar8 = paVar9;
    paVar11 = paVar12;
    paVar12 = (anon_union_80_3_cd421760_for_sfmt *)((long)paVar12 + 0x10);
  } while (lVar10 != -0x38);
  lVar10 = 2;
  paVar8 = (anon_union_80_3_cd421760_for_sfmt *)((this->sfmt).u + 0xc);
  paVar11 = (anon_union_80_3_cd421760_for_sfmt *)((this->sfmt).u + 8);
  do {
    paVar12 = paVar8;
    uVar1 = paVar9->u[3];
    QVar7 = paVar9->u64[1];
    QVar6 = paVar9->u64[1];
    QVar5 = paVar9->u64[0];
    uVar2 = paVar12->u[1];
    uVar3 = paVar12->u[0];
    uVar4 = paVar12->u[2];
    paVar12->u[0] =
         paVar11->u[0] << 0xf ^ (uint)(QVar5 >> 0x18) ^
         (*(uint *)((long)paVar12 + -0x30) >> 0xd & 0x737ff | uVar3 << 0x18) ^ uVar3;
    paVar12->u[1] =
         paVar11->u[1] << 0xf ^ *(uint *)((long)paVar12 + -0x2c) >> 0xd & 0x73f7d ^ uVar2 ^
         ((uint)(byte)(QVar5 >> 0x38) | (uint)(((ulong)(uint)QVar7 << 0x28) >> 0x20)) ^
         ((uint)(((ulong)uVar2 << 0x38) >> 0x20) | uVar3 >> 8);
    paVar12->u[2] =
         paVar11->u[2] << 0xf ^ uVar4 ^
         (uint)(QVar6 >> 0x18) ^
         *(uint *)((long)paVar12 + -0x28) >> 0xd & 0x77b7d ^ (uVar4 << 0x18 | uVar2 >> 8);
    paVar12->u[3] =
         paVar11->u[3] << 0xf ^ paVar12->u[3] ^
         *(uint *)((long)paVar12 + -0x24) >> 0xd & 0x7fb2f ^ uVar1 >> 0x18 ^
         ((uint)(((ulong)paVar12->u[3] << 0x38) >> 0x20) | uVar4 >> 8);
    lVar10 = lVar10 + -1;
    paVar9 = paVar11;
    paVar8 = (anon_union_80_3_cd421760_for_sfmt *)((long)paVar12 + 0x10);
    paVar11 = paVar12;
  } while (lVar10 != 0);
  return;
}

Assistant:

void FRandom::GenRandAll()
{
	int i;
	w128_t *r1, *r2;

	r1 = &sfmt.w128[SFMT::N - 2];
	r2 = &sfmt.w128[SFMT::N - 1];
	for (i = 0; i < SFMT::N - POS1; i++) {
		do_recursion(&sfmt.w128[i], &sfmt.w128[i], &sfmt.w128[i + POS1], r1, r2);
		r1 = r2;
		r2 = &sfmt.w128[i];
	}
	for (; i < SFMT::N; i++) {
		do_recursion(&sfmt.w128[i], &sfmt.w128[i], &sfmt.w128[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &sfmt.w128[i];
	}
}